

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_subexp_decode(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  cram_external_type cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint local_50;
  cram_external_type local_4c;
  int val;
  int tail;
  int i;
  int k;
  int count;
  int n;
  int32_t *out_i;
  int *out_size_local;
  char *out_local;
  cram_block *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  cVar1 = (c->field_6).external.type;
  i = 0;
  iVar2 = *out_size;
  for (; i < iVar2; i = i + 1) {
    iVar3 = get_one_bits_MSB(in);
    if (iVar3 == 0) {
      local_50 = 0;
      for (local_4c = cVar1; local_4c != 0; local_4c = local_4c - E_INT) {
        local_50 = (int)(uint)in->data[in->byte] >> ((byte)in->bit & 0x1f) & 1U | local_50 << 1;
        iVar3 = in->bit + -1;
        in->bit = iVar3;
        in->byte = (long)(int)(uint)(iVar3 < 0) + in->byte;
        in->bit = in->bit & 7;
      }
    }
    else {
      local_4c = iVar3 + cVar1;
      local_50 = 0;
      while (local_4c = local_4c + -1, local_4c != 0) {
        local_50 = (int)(uint)in->data[in->byte] >> ((byte)in->bit & 0x1f) & 1U | local_50 << 1;
        iVar4 = in->bit + -1;
        in->bit = iVar4;
        in->byte = (long)(int)(uint)(iVar4 < 0) + in->byte;
        in->bit = in->bit & 7;
      }
      local_50 = (1 << (((char)iVar3 + (char)cVar1) - 1U & 0x1f)) + local_50;
    }
    *(uint *)(out + (long)i * 4) = local_50 - (c->field_6).huffman.ncodes;
  }
  return 0;
}

Assistant:

int cram_subexp_decode(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int n, count;
    int k = c->subexp.k;

    for (count = 0, n = *out_size; count < n; count++) {
	int i = 0, tail;
	int val;

	/* Get number of 1s */
	//while (get_bit_MSB(in) == 1) i++;
	i = get_one_bits_MSB(in);

	/*
	 * Val is
	 * i > 0:  2^(k+i-1) + k+i-1 bits
	 * i = 0:  k bits
	 */
	if (i) {
	    tail = i + k-1;
	    val = 0;
	    while (tail) {
		//val = val<<1; val |= get_bit_MSB(in);
		GET_BIT_MSB(in, val);
		tail--;
	    }
	    val += 1 << (i + k-1);
	} else {
	    tail = k;
	    val = 0;
	    while (tail) {
		//val = val<<1; val |= get_bit_MSB(in);
		GET_BIT_MSB(in, val);
		tail--;
	    }
	}

	out_i[count] = val - c->subexp.offset;
    }

    return 0;
}